

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  ForkBranchBase *pFVar1;
  ForkHubBase *pFVar2;
  Disposer *pDVar3;
  ForkBranchBase ***pppFVar4;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00628898;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    pFVar1 = this->next;
    *this->prevPtr = pFVar1;
    pppFVar4 = &pFVar1->prevPtr;
    if (pFVar1 == (ForkBranchBase *)0x0) {
      pppFVar4 = &((this->hub).ptr)->tailBranch;
    }
    *pppFVar4 = this->prevPtr;
  }
  pFVar2 = (this->hub).ptr;
  if (pFVar2 != (ForkHubBase *)0x0) {
    (this->hub).ptr = (ForkHubBase *)0x0;
    pDVar3 = (this->hub).disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pFVar2->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pFVar2->super_Refcounted).super_Disposer._vptr_Disposer);
    return;
  }
  return;
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}